

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::SourceCodeInfo::SourceCodeInfo(SourceCodeInfo *this)

{
  undefined8 *in_RDI;
  Arena *in_stack_ffffffffffffffb8;
  InternalMetadataWithArena *in_stack_ffffffffffffffc0;
  
  Message::Message((Message *)in_stack_ffffffffffffffc0);
  *in_RDI = &PTR__SourceCodeInfo_0089aa30;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  memset(in_RDI + 2,0,4);
  internal::CachedSize::CachedSize((CachedSize *)0x69e842);
  RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *)0x69e855);
  SharedCtor((SourceCodeInfo *)0x69e861);
  return;
}

Assistant:

SourceCodeInfo::SourceCodeInfo()
  : ::PROTOBUF_NAMESPACE_ID::Message(), _internal_metadata_(nullptr) {
  SharedCtor();
  // @@protoc_insertion_point(constructor:google.protobuf.SourceCodeInfo)
}